

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O0

void __thiscall soplex::SoPlexBase<double>::_optimize(SoPlexBase<double> *this,bool *interrupt)

{
  bool bVar1;
  SoPlexBase<double> *in_RDI;
  Real RVar2;
  double dVar3;
  bool *in_stack_00000090;
  bool in_stack_0000009f;
  SoPlexBase<double> *in_stack_000000a0;
  Real in_stack_ffffffffffffffd8;
  int type;
  SPxSolverBase<double> *in_stack_ffffffffffffffe0;
  
  SolBase<double>::invalidate(&in_RDI->_solReal);
  in_RDI->_optimizeCalls = in_RDI->_optimizeCalls + 1;
  (*in_RDI->_statistics->solvingTime->_vptr_Timer[3])();
  bVar1 = boolParam(in_RDI,PERSISTENTSCALING);
  if (bVar1) {
    if (((in_RDI->_scaler == (SPxScaler<double> *)0x0) ||
        (bVar1 = SPxLPBase<double>::isScaled(in_RDI->_realLP), bVar1)) ||
       (bVar1 = _reapplyPersistentScaling(in_RDI), !bVar1)) {
      if ((in_RDI->_scaler == (SPxScaler<double> *)0x0) &&
         (bVar1 = SPxLPBase<double>::isScaled(in_RDI->_realLP), bVar1)) {
        SPxSolverBase<double>::unscaleLPandReloadBasis(in_stack_ffffffffffffffe0);
        in_RDI->_isRealLPScaled = false;
        in_RDI->_unscaleCalls = in_RDI->_unscaleCalls + 1;
      }
    }
    else {
      (*in_RDI->_scaler->_vptr_SPxScaler[0xd])(in_RDI->_scaler,in_RDI->_realLP,1);
      bVar1 = SPxLPBase<double>::isScaled(in_RDI->_realLP);
      in_RDI->_isRealLPScaled = bVar1;
      SPxSolverBase<double>::invalidateBasis(in_stack_ffffffffffffffe0);
    }
  }
  in_RDI->_lastSolveMode = 0;
  if ((in_RDI->_hasBasis & 1U) == 0) {
    in_stack_ffffffffffffffe0 = (SPxSolverBase<double> *)realParam(in_RDI,OBJLIMIT_LOWER);
    RVar2 = realParam(in_RDI,INFTY);
    if (((double)in_stack_ffffffffffffffe0 == -RVar2) &&
       (!NAN((double)in_stack_ffffffffffffffe0) && !NAN(-RVar2))) {
      in_stack_ffffffffffffffd8 = realParam(in_RDI,OBJLIMIT_UPPER);
      RVar2 = realParam(in_RDI,INFTY);
      if ((in_stack_ffffffffffffffd8 == RVar2) && (!NAN(in_stack_ffffffffffffffd8) && !NAN(RVar2)))
      {
        _preprocessAndSolveReal(in_stack_000000a0,in_stack_0000009f,in_stack_00000090);
        type = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
        goto LAB_0041e034;
      }
    }
  }
  type = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  _preprocessAndSolveReal(in_stack_000000a0,in_stack_0000009f,in_stack_00000090);
LAB_0041e034:
  dVar3 = SPxSolverBase<double>::getBasisMetric(in_stack_ffffffffffffffe0,type);
  in_RDI->_statistics->finalBasisCondition = dVar3;
  (*in_RDI->_statistics->solvingTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SoPlexBase<R>::_optimize(volatile bool* interrupt)
{
   assert(_realLP != nullptr);
   assert(_realLP == &_solver);

   _solReal.invalidate();
   ++_optimizeCalls;

   // start timing
   _statistics->solvingTime->start();

   if(boolParam(SoPlexBase<R>::PERSISTENTSCALING))
   {
      // scale original problem; overwriting _realLP
      if(_scaler && !_realLP->isScaled() && _reapplyPersistentScaling())
      {
#ifdef SOPLEX_DEBUG
         SPxLPBase<R>* origLP = 0;
         spx_alloc(origLP);
         origLP = new(origLP) SPxLPBase<R>(*_realLP);
#endif
         _scaler->scale(*_realLP, true);
         _isRealLPScaled = _realLP->isScaled(); // a scaler might decide not to apply scaling
         _solver.invalidateBasis();
#ifdef SOPLEX_DEBUG
         _checkScaling(origLP);
#endif
      }
      // unscale previously scaled problem, overwriting _realLP
      else if(!_scaler && _realLP->isScaled())
      {
         _solver.unscaleLPandReloadBasis();
         _isRealLPScaled = false;
         ++_unscaleCalls;
      }
   }

   // remember that last solve was in floating-point
   _lastSolveMode = SOLVEMODE_REAL;

   // solve and store solution; if we have a starting basis, do not apply preprocessing; if we are solving from
   // scratch, apply preprocessing according to parameter settings
   if(!_hasBasis && realParam(SoPlexBase<R>::OBJLIMIT_LOWER) == -realParam(SoPlexBase<R>::INFTY)
         && realParam(SoPlexBase<R>::OBJLIMIT_UPPER) == realParam(SoPlexBase<R>::INFTY))
      _preprocessAndSolveReal(true, interrupt);
   else
      _preprocessAndSolveReal(false, interrupt);

   _statistics->finalBasisCondition = _solver.getBasisMetric(0);

   // stop timing
   _statistics->solvingTime->stop();
}